

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O0

_Bool upb_FieldDef_IsPacked(upb_FieldDef *f)

{
  _Bool _Var1;
  int32_t iVar2;
  _Bool local_11;
  upb_FieldDef *f_local;
  
  _Var1 = _upb_FieldDef_IsPackable(f);
  local_11 = false;
  if (_Var1) {
    iVar2 = google_protobuf_FeatureSet_repeated_field_encoding(f->resolved_features);
    local_11 = iVar2 == 1;
  }
  return local_11;
}

Assistant:

bool upb_FieldDef_IsPacked(const upb_FieldDef* f) {
  return _upb_FieldDef_IsPackable(f) &&
         UPB_DESC(FeatureSet_repeated_field_encoding(f->resolved_features)) ==
             UPB_DESC(FeatureSet_PACKED);
}